

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNSparseMatrix_Reallocate(SUNMatrix A,sunindextype NNZ)

{
  void *pvVar1;
  long in_RSI;
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  
  pvVar1 = realloc(*(void **)(*in_RDI + 0x30),in_RSI << 3);
  *(void **)(*in_RDI + 0x30) = pvVar1;
  pvVar1 = realloc(*(void **)(*in_RDI + 0x20),in_RSI << 3);
  *(void **)(*in_RDI + 0x20) = pvVar1;
  *(long *)(*in_RDI + 0x10) = in_RSI;
  return 0;
}

Assistant:

SUNErrCode SUNSparseMatrix_Reallocate(SUNMatrix A, sunindextype NNZ)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(NNZ >= 0, SUN_ERR_ARG_OUTOFRANGE);

  /* perform reallocation */
  SM_INDEXVALS_S(A) = (sunindextype*)realloc(SM_INDEXVALS_S(A),
                                             NNZ * sizeof(sunindextype));
  SUNAssert(SM_INDEXVALS_S(A), SUN_ERR_MALLOC_FAIL);

  SM_DATA_S(A) = (sunrealtype*)realloc(SM_DATA_S(A), NNZ * sizeof(sunrealtype));
  SUNAssert(SM_DATA_S(A), SUN_ERR_MALLOC_FAIL);

  SM_NNZ_S(A) = NNZ;

  return SUN_SUCCESS;
}